

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.cc
# Opt level: O0

int X509_REVOKED_set_revocationDate(X509_REVOKED *r,ASN1_TIME *tm)

{
  ASN1_STRING *local_28;
  ASN1_TIME *in;
  ASN1_TIME *tm_local;
  X509_REVOKED *revoked_local;
  
  if (r == (X509_REVOKED *)0x0) {
    revoked_local._4_4_ = 0;
  }
  else {
    local_28 = r->revocationDate;
    if ((local_28 != tm) && (local_28 = ASN1_STRING_dup(tm), local_28 != (ASN1_STRING *)0x0)) {
      ASN1_TIME_free(r->revocationDate);
      r->revocationDate = local_28;
    }
    revoked_local._4_4_ = (uint)(local_28 != (ASN1_STRING *)0x0);
  }
  return revoked_local._4_4_;
}

Assistant:

int X509_REVOKED_set_revocationDate(X509_REVOKED *revoked,
                                    const ASN1_TIME *tm) {
  ASN1_TIME *in;

  if (revoked == NULL) {
    return 0;
  }
  in = revoked->revocationDate;
  if (in != tm) {
    in = ASN1_STRING_dup(tm);
    if (in != NULL) {
      ASN1_TIME_free(revoked->revocationDate);
      revoked->revocationDate = in;
    }
  }
  return in != NULL;
}